

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  MapFieldBase *this;
  size_t sVar5;
  size_t sVar6;
  Reflection *this_00;
  ulong uVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  this_00 = MVar8.reflection;
  if ((((field->field_0x1 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    bVar3 = FieldDescriptor::is_repeated(field);
    if (!bVar3) {
      sVar5 = MessageSetItemByteSize(field,message);
      return sVar5;
    }
  }
  bVar3 = FieldDescriptor::is_repeated(field);
  if (!bVar3) {
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar3 = Reflection::HasField(this_00,message,field);
      uVar7 = (ulong)bVar3;
    }
    else {
      uVar7 = 1;
    }
    goto LAB_00cde57e;
  }
  bVar3 = FieldDescriptor::is_map(field);
  if (bVar3) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar3 = MapFieldBase::IsMapValid(this);
    if (!bVar3) goto LAB_00cde559;
    uVar4 = MapFieldBase::size(this);
  }
  else {
LAB_00cde559:
    uVar4 = Reflection::FieldSize(this_00,message,field);
  }
  uVar7 = (ulong)uVar4;
LAB_00cde57e:
  sVar5 = FieldDataOnlyByteSize(field,message);
  bVar3 = FieldDescriptor::is_packed(field);
  if (bVar3) {
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      uVar4 = field->number_ * 8 + 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = (iVar2 * 9 + 0x49U >> 6) + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
  }
  else {
    sVar6 = WireFormatLite::TagSize(field->number_,(uint)field->type_);
    sVar5 = sVar6 * uVar7 + sVar5;
  }
  return sVar5;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      const MapFieldBase* map_field =
          message_reflection->GetMapData(message, field);
      if (map_field->IsMapValid()) {
        count = FromIntSize(map_field->size());
      } else {
        count = FromIntSize(message_reflection->FieldSize(message, field));
      }
    } else {
      count = FromIntSize(message_reflection->FieldSize(message, field));
    }
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}